

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDebug.c
# Opt level: O0

int Abc_NtkFindGivenFanin(Abc_Ntk_t *pNtk,int Step,Abc_Obj_t **ppObj,Abc_Obj_t **ppFanin)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pNode;
  bool bVar2;
  int local_4c;
  int local_48;
  int Counter;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Obj_t **ppFanin_local;
  Abc_Obj_t **ppObj_local;
  int Step_local;
  Abc_Ntk_t *pNtk_local;
  
  local_4c = 0;
  Counter = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= Counter) {
      return 0;
    }
    pObj_00 = Abc_NtkObj(pNtk,Counter);
    if (pObj_00 != (Abc_Obj_t *)0x0) {
      for (local_48 = 0; iVar1 = Abc_ObjFaninNum(pObj_00), local_48 < iVar1; local_48 = local_48 + 1
          ) {
        pNode = Abc_ObjFanin(pObj_00,local_48);
        iVar1 = Abc_ObjIsNode(pObj_00);
        if ((((iVar1 != 0) || (iVar1 = Abc_ObjIsPo(pObj_00), iVar1 != 0)) &&
            ((iVar1 = Abc_ObjIsPo(pObj_00), iVar1 == 0 || (iVar1 = Abc_NtkPoNum(pNtk), iVar1 != 1)))
            ) && (((iVar1 = Abc_ObjIsNode(pObj_00), iVar1 == 0 ||
                   (iVar1 = Abc_NodeIsConst(pNode), iVar1 == 0)) &&
                  (bVar2 = local_4c == Step, local_4c = local_4c + 1, bVar2)))) {
          *ppObj = pObj_00;
          *ppFanin = pNode;
          return 1;
        }
      }
    }
    Counter = Counter + 1;
  } while( true );
}

Assistant:

int Abc_NtkFindGivenFanin( Abc_Ntk_t * pNtk, int Step, Abc_Obj_t ** ppObj, Abc_Obj_t ** ppFanin )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( !Abc_ObjIsNode(pObj) && !Abc_ObjIsPo(pObj) )
                continue;
            if ( Abc_ObjIsPo(pObj) && Abc_NtkPoNum(pNtk) == 1 )
                continue;
            if ( Abc_ObjIsNode(pObj) && Abc_NodeIsConst(pFanin) )
                continue;
            if ( Counter++ == Step )
            {
                *ppObj   = pObj;
                *ppFanin = pFanin;
                return 1;
            }
        }
    return 0;
}